

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_std::bitset<128UL>_&,_const_std::bitset<128UL>_&> * __thiscall
Catch::ExprLhs<std::bitset<128ul>const&>::operator==
          (BinaryExpr<const_std::bitset<128UL>_&,_const_std::bitset<128UL>_&>
           *__return_storage_ptr__,ExprLhs<std::bitset<128ul>const&> *this,bitset<128UL> *rhs)

{
  bitset<128UL> *pbVar1;
  _WordT _Var2;
  _WordT _Var3;
  _WordT _Var4;
  _WordT _Var5;
  StringRef local_40;
  
  pbVar1 = *(bitset<128UL> **)this;
  _Var2 = (pbVar1->super__Base_bitset<2UL>)._M_w[0];
  _Var3 = (rhs->super__Base_bitset<2UL>)._M_w[0];
  _Var4 = (rhs->super__Base_bitset<2UL>)._M_w[1];
  _Var5 = (pbVar1->super__Base_bitset<2UL>)._M_w[1];
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = _Var4 == _Var5 && _Var2 == _Var3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0099a060;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }